

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_26382a::BuildSystemImpl::build(BuildSystemImpl *this,StringRef target)

{
  StringRef Key;
  bool bVar1;
  BuildDescription *pBVar2;
  char *in_RCX;
  StringRef name;
  BuildKey local_190;
  Optional<llbuild::buildsystem::BuildValue> local_170;
  Twine local_f8;
  Twine local_e0;
  Twine local_c8;
  StringRef local_b0;
  StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_>
  local_a0;
  BuildSystemImpl *local_98;
  char *local_90;
  StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_>
  local_88;
  StringMap<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>,_llvm::MallocAllocator>
  *local_80;
  target_set *targets;
  Twine local_68;
  StringRef local_50;
  BuildSystemImpl *local_40;
  BuildSystemImpl *this_local;
  StringRef target_local;
  
  target_local.Data = (char *)target.Length;
  this_local = (BuildSystemImpl *)target.Data;
  local_40 = this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->buildDescription);
  if (bVar1) {
    if (target_local.Data == (char *)0x0) {
      pBVar2 = getBuildDescription(this);
      llbuild::buildsystem::BuildDescription::getDefaultTarget_abi_cxx11_(pBVar2);
      targets = (target_set *)std::__cxx11::string::data();
      in_RCX = (char *)std::__cxx11::string::length();
      this_local = (BuildSystemImpl *)targets;
      target_local.Data = in_RCX;
    }
    pBVar2 = getBuildDescription(this);
    local_80 = llbuild::buildsystem::BuildDescription::getTargets(pBVar2);
    local_98 = this_local;
    local_90 = target_local.Data;
    Key.Length = (size_t)target_local.Data;
    Key.Data = (char *)this_local;
    local_88.Ptr = (StringMapEntryBase **)
                   llvm::
                   StringMap<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>,_llvm::MallocAllocator>
                   ::find(local_80,Key);
    local_a0.Ptr = (StringMapEntryBase **)
                   llvm::
                   StringMap<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>,_llvm::MallocAllocator>
                   ::end(local_80);
    bVar1 = llvm::
            StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_>
            ::operator==(&local_88,
                         (StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>
                          *)&local_a0);
    if (bVar1) {
      local_b0 = getMainFilename(this);
      llvm::operator+(&local_e0,"No target named \'",(StringRef *)&this_local);
      llvm::Twine::Twine(&local_f8,"\' in build description");
      llvm::operator+(&local_c8,&local_e0,&local_f8);
      error(this,local_b0,&local_c8);
      target_local.Length._7_1_ = 0;
    }
    else {
      name.Length = (size_t)in_RCX;
      name.Data = target_local.Data;
      llbuild::buildsystem::BuildKey::makeTarget(&local_190,(BuildKey *)this_local,name);
      build(&local_170,this,&local_190);
      target_local.Length._7_1_ =
           llvm::Optional<llbuild::buildsystem::BuildValue>::hasValue(&local_170);
      llvm::Optional<llbuild::buildsystem::BuildValue>::~Optional(&local_170);
      llbuild::buildsystem::BuildKey::~BuildKey(&local_190);
    }
  }
  else {
    local_50 = getMainFilename(this);
    llvm::Twine::Twine(&local_68,"no build description loaded");
    error(this,local_50,&local_68);
    target_local.Length._7_1_ = 0;
  }
  return (bool)(target_local.Length._7_1_ & 1);
}

Assistant:

bool BuildSystemImpl::build(StringRef target) {
  // The build description must have been loaded.
  if (!buildDescription) {
    error(getMainFilename(), "no build description loaded");
    return false;
  }

  // If target name is not passed then we try to load the default target name
  // from manifest file
  if (target.empty()) {
    target = getBuildDescription().getDefaultTarget();
  }

  // Validate the target name.
  auto& targets = getBuildDescription().getTargets();
  if (targets.find(target) == targets.end()) {
    error(getMainFilename(), "No target named '" + target + "' in build description");
    return false;
  }

  return build(BuildKey::makeTarget(target)).hasValue();
}